

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  ostream *poVar4;
  pointer *__ptr;
  char *pcVar5;
  size_t i;
  long lVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    pcVar5 = "a surjection from elements to requirements exists such that:\n";
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        lVar6 = *(long *)(this + 8);
        lVar2 = *(long *)(this + 0x10);
        if (lVar6 == lVar2) {
          std::operator<<(os,"is empty");
          return;
        }
        local_38._M_head_impl = in_RAX;
        poVar4 = std::operator<<(os,"has ");
        if (lVar2 - lVar6 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_38,1);
          poVar4 = testing::operator<<(poVar4,(Message *)&local_38);
          std::operator<<(poVar4," and that element ");
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
          (**(code **)(*(long *)**(undefined8 **)(this + 8) + 0x10))
                    ((long *)**(undefined8 **)(this + 8),os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_38,
                 *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
        poVar4 = testing::operator<<(poVar4,(Message *)&local_38);
        std::operator<<(poVar4," and there exists some permutation of elements such that:\n");
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      goto LAB_001100ae;
    }
    pcVar5 = "an injection from elements to requirements exists such that:\n";
  }
  std::operator<<(os,pcVar5);
LAB_001100ae:
  pcVar5 = "";
  for (lVar6 = 0; lVar6 != *(long *)(this + 0x10) - *(long *)(this + 8) >> 3; lVar6 = lVar6 + 1) {
    std::operator<<(os,pcVar5);
    if (*(int *)this == 3) {
      poVar4 = std::operator<<(os," - element #");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar5 = " ";
    }
    else {
      pcVar5 = " - an element ";
      poVar4 = os;
    }
    std::operator<<(poVar4,pcVar5);
    plVar3 = *(long **)(*(long *)(this + 8) + lVar6 * 8);
    (**(code **)(*plVar3 + 0x10))(plVar3,os);
    pcVar5 = "\n";
    if (*(int *)this == 3) {
      pcVar5 = ", and\n";
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "is empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "has " << Elements(1) << " and that element ";
        matcher_describers_[0]->DescribeTo(os);
        return;
      }
      *os << "has " << Elements(matcher_describers_.size())
          << " and there exists some permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "a surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "an injection from elements to requirements exists such that:\n";
      break;
  }

  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}